

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

void R_RenderFakeWallRange(drawseg_t *ds,int x1,int x2)

{
  uint uVar1;
  sector_t *psVar2;
  extsector_t *peVar3;
  secplane_t *psVar4;
  secplane_t *psVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  FTexture *pFVar9;
  seg_t **ppsVar10;
  side_t **ppsVar11;
  F3DFloor *rover;
  uint uVar12;
  long lVar13;
  F3DFloor *pFVar14;
  long lVar15;
  lightlist_t *plVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  uint *local_48;
  
  sprflipvert = false;
  curline = ds->curline;
  psVar2 = curline->frontsector;
  backsector = curline->backsector;
  frontsector = psVar2;
  if (backsector != (sector_t *)0x0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      frontsector = backsector;
      backsector = psVar2;
    }
    dVar20 = (backsector->centerspot).X;
    dVar22 = (backsector->centerspot).Y;
    dVar21 = ((backsector->floorplane).normal.Y * dVar22 +
             (backsector->floorplane).normal.X * dVar20 + (backsector->floorplane).D) *
             (backsector->floorplane).negiC;
    if ((fake3D & 1U) == 0) {
      sclipBottom = dVar21;
    }
    dVar20 = (dVar22 * (backsector->ceilingplane).normal.Y +
             dVar20 * (backsector->ceilingplane).normal.X + (backsector->ceilingplane).D) *
             (backsector->ceilingplane).negiC;
    if ((fake3D & 2U) == 0) {
      sclipTop = dVar20;
    }
    dVar22 = (frontsector->centerspot).X;
    dVar23 = (frontsector->centerspot).Y;
    if ((sclipBottom <
         ((frontsector->ceilingplane).normal.Y * dVar23 +
         (frontsector->ceilingplane).D + (frontsector->ceilingplane).normal.X * dVar22) *
         (frontsector->ceilingplane).negiC) &&
       (((frontsector->floorplane).normal.Y * dVar23 +
        (frontsector->floorplane).D + (frontsector->floorplane).normal.X * dVar22) *
        (frontsector->floorplane).negiC < sclipTop)) {
      peVar3 = backsector->e;
      uVar12 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if ((fake3D & 8U) == 0) {
        if (0 < (int)uVar12) {
          uVar17 = 0;
          do {
            rover = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar17];
            uVar18 = rover->flags;
            if ((uVar18 & 1) != 0) {
              if (((((uVar18 & 4) == 0) ||
                   (psVar4 = (rover->top).plane,
                   (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0)) ||
                  (psVar5 = (rover->bottom).plane,
                  (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0)) ||
                 (((dVar22 = psVar5->D * psVar5->negiC, sclipTop <= dVar22 ||
                   (dVar23 = psVar4->D * psVar4->negiC, dVar23 <= dVar21)) || (dVar20 <= dVar22))))
              {
                if (uVar12 - 1 != uVar17) goto LAB_0030f72e;
              }
              else if (sclipBottom < dVar23) {
                uVar12 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count
                ;
                if ((long)(int)uVar12 < 1) goto LAB_0030fcca;
                lVar15 = 0;
                goto LAB_0030faea;
              }
              rw_pic = (FTexture *)0x0;
              uVar12 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              if ((long)(int)uVar12 < 1) {
                rw_pic = (FTexture *)0x0;
                sprflipvert = false;
                return;
              }
              lVar15 = 0;
              while( true ) {
                pFVar14 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                          Array[lVar15];
                if (pFVar14->model == rover->model) {
                  rw_pic = (FTexture *)0x0;
                  sprflipvert = false;
                  return;
                }
                if (((((~pFVar14->flags & 5) == 0) &&
                     (psVar4 = (pFVar14->top).plane,
                     (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
                    (psVar5 = (pFVar14->bottom).plane,
                    (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0)) &&
                   (psVar5->D * psVar5->negiC < sclipTop)) break;
                lVar15 = lVar15 + 1;
                if ((int)uVar12 == lVar15) {
                  rw_pic = (FTexture *)0x0;
                  sprflipvert = false;
                  return;
                }
              }
              if ((pFVar14->flags & 0x2200) == 0) {
                rw_pic = (FTexture *)0x0;
                sprflipvert = false;
                return;
              }
              if (psVar4->D * psVar4->negiC <= sclipBottom) {
                rw_pic = (FTexture *)0x0;
                sprflipvert = false;
                return;
              }
              if (uVar12 == (uint)lVar15) {
                rw_pic = (FTexture *)0x0;
                sprflipvert = false;
                return;
              }
              uVar12 = pFVar14->flags;
              pFVar9 = (FTexture *)0xffffffffffffffff;
              if ((uVar18 & uVar12 & 0x10) == 0) {
                if ((uVar12 >> 0x11 & 1) == 0) {
                  if ((uVar12 >> 0x12 & 1) == 0) {
                    ppsVar11 = pFVar14->master->sidedef;
                    lVar15 = 0x60;
                  }
                  else {
                    ppsVar11 = &curline->sidedef;
                    lVar15 = 0x90;
                  }
                }
                else {
                  ppsVar11 = &curline->sidedef;
                  lVar15 = 0x30;
                }
                pFVar9 = FTextureManager::operator()
                                   (&TexMan,(FTextureID)
                                            *(int *)((long)(*ppsVar11)->textures + lVar15 + -0x10),
                                    true);
                if (pFVar9 != (FTexture *)0x0) goto LAB_0030fd25;
                goto LAB_0030fcca;
              }
              goto LAB_0030fd25;
            }
LAB_0030f72e:
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
      }
      else if (-1 < (int)(uVar12 - 1)) {
        bVar7 = false;
        uVar17 = (ulong)(uVar12 - 1);
LAB_0030f760:
        rover = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar17];
        uVar12 = rover->flags;
        if ((uVar12 & 1) != 0) {
          if (((((uVar12 & 4) == 0) ||
               (psVar4 = (rover->top).plane, (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0)
               ) || (psVar5 = (rover->bottom).plane,
                    (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0)) ||
             (((dVar22 = psVar4->D * psVar4->negiC, dVar22 <= sclipBottom ||
               (dVar20 <= psVar5->D * psVar5->negiC)) || (dVar22 <= dVar21)))) {
            if (uVar17 != 0) goto LAB_0030f8cf;
            bVar6 = true;
          }
          else {
            bVar6 = false;
          }
          rw_pic = (FTexture *)0x0;
          if ((bVar6) || (psVar4 = (rover->bottom).plane, sclipTop <= psVar4->D * psVar4->negiC)) {
            if (bVar7) {
              rw_pic = (FTexture *)0x0;
              sprflipvert = false;
              return;
            }
            uVar18 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            uVar17 = (ulong)uVar18;
            if ((int)(uVar18 - 1) < 0) {
              rw_pic = (FTexture *)0x0;
              sprflipvert = false;
              return;
            }
            while( true ) {
              uVar18 = (int)uVar17 - 1;
              uVar17 = (ulong)uVar18;
              pFVar14 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                        [uVar17];
              if (pFVar14->model == rover->model) {
                rw_pic = (FTexture *)0x0;
                sprflipvert = false;
                return;
              }
              if (((((~pFVar14->flags & 5) == 0) &&
                   (psVar4 = (pFVar14->top).plane,
                   (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
                  (psVar5 = (pFVar14->bottom).plane,
                  (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0)) &&
                 (sclipBottom < psVar4->D * psVar4->negiC)) break;
              if ((int)uVar18 < 1) {
                rw_pic = (FTexture *)0x0;
                sprflipvert = false;
                return;
              }
            }
            if (sclipTop <= psVar5->D * psVar5->negiC) {
              rw_pic = (FTexture *)0x0;
              sprflipvert = false;
              return;
            }
            if ((pFVar14->flags & 0x2200) == 0) {
              rw_pic = (FTexture *)0x0;
              sprflipvert = false;
              return;
            }
            uVar18 = pFVar14->flags;
            pFVar9 = (FTexture *)0xffffffffffffffff;
            if ((uVar12 & uVar18 & 0x10) == 0) {
              if ((uVar18 >> 0x11 & 1) == 0) {
                if ((uVar18 >> 0x12 & 1) == 0) {
                  ppsVar11 = pFVar14->master->sidedef;
                  lVar15 = 0x60;
                }
                else {
                  ppsVar11 = &curline->sidedef;
                  lVar15 = 0x90;
                }
              }
              else {
                ppsVar11 = &curline->sidedef;
                lVar15 = 0x30;
              }
              rw_pic = FTextureManager::operator()
                                 (&TexMan,(FTextureID)
                                          *(int *)((long)(*ppsVar11)->textures + lVar15 + -0x10),
                                  true);
              pFVar9 = rw_pic;
              if (rw_pic == (FTexture *)0x0) {
LAB_0030fecd:
                lVar15 = 0x30;
                lVar13 = 0x10;
                if ((rover->flags >> 0x11 & 1) == 0) {
                  lVar15 = 0x90;
                  ppsVar10 = &curline;
                  if ((rover->flags >> 0x12 & 1) == 0) {
                    ppsVar10 = (seg_t **)&rover->master;
                    lVar15 = 0x60;
                    lVar13 = 0x48;
                  }
                }
                else {
                  ppsVar10 = &curline;
                }
                pFVar9 = FTextureManager::operator()
                                   (&TexMan,(FTextureID)
                                            *(int *)(*(long *)((long)((line_t *)*ppsVar10)->args +
                                                              lVar13 + -0x2c) + lVar15),true);
LAB_0030ff29:
                pFVar14 = (F3DFloor *)0x0;
              }
            }
            rw_pic = pFVar9;
            basecolormap = frontsector->ColorMap;
            wallshade = ds->shade;
            if (fixedlightlev < 0) {
              if ((ds->bFakeBoundary & 3) == 2) {
                uVar12 = (backsector->e->XFloor).lightlist.Count;
                do {
                  uVar12 = uVar12 - 1;
                  if ((int)uVar12 < 0) goto LAB_00310083;
                  uVar17 = (ulong)(uVar12 & 0x7fffffff);
                  plVar16 = (backsector->e->XFloor).lightlist.Array;
                } while (plVar16[uVar17].plane.D * plVar16[uVar17].plane.negiC < sclipTop);
LAB_0031002f:
                basecolormap = plVar16[uVar17].extra_colormap;
                iVar8 = side_t::GetLightLevel
                                  (curline->sidedef,foggy,(int)*plVar16[uVar17].p_lightlevel,
                                   plVar16[uVar17].lightsource != (F3DFloor *)0x0,(int *)0x0);
                wallshade = (iVar8 + r_actualextralight) * -0x4000 + 0x3d0000;
              }
              else {
                uVar12 = (frontsector->e->XFloor).lightlist.Count;
                while (uVar12 = uVar12 - 1, -1 < (int)uVar12) {
                  uVar17 = (ulong)(uVar12 & 0x7fffffff);
                  plVar16 = (frontsector->e->XFloor).lightlist.Array;
                  if (sclipTop <= plVar16[uVar17].plane.D * plVar16[uVar17].plane.negiC)
                  goto LAB_0031002f;
                }
              }
            }
LAB_00310083:
            if (rw_pic == (FTexture *)0xffffffffffffffff) {
              rw_pic = (FTexture *)0x0;
              return;
            }
            if (pFVar14 != (F3DFloor *)0x0) {
              rover = pFVar14;
            }
            goto LAB_003100a0;
          }
          uVar18 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          uVar19 = (ulong)uVar18;
          if ((uVar18 == 0) || ((int)(uVar18 - 1) < 0)) goto LAB_0030fecd;
          while( true ) {
            uVar18 = (int)uVar19 - 1;
            uVar19 = (ulong)uVar18;
            pFVar14 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                      [uVar19];
            bVar7 = true;
            if (pFVar14->model == rover->model) break;
            uVar1 = pFVar14->flags;
            if ((((~uVar1 & 5) == 0) &&
                (psVar4 = (pFVar14->top).plane,
                (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
               ((psVar5 = (pFVar14->bottom).plane,
                (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0 &&
                (sclipBottom < psVar4->D * psVar4->negiC)))) {
              if (sclipTop <= psVar5->D * psVar5->negiC) goto LAB_0030fecd;
              if (((uVar1 & 2) != (uVar12 & 2)) ||
                 (((uVar1 & 2) == 0 && ((pFVar14->alpha == 0xff || (rover->alpha == 0xff)))))) {
                if ((uVar12 & uVar1 & 0x10) == 0) goto LAB_0030fecd;
                pFVar9 = (FTexture *)0xffffffffffffffff;
                goto LAB_0030ff29;
              }
              break;
            }
            if ((int)uVar18 < 1) goto LAB_0030fecd;
          }
        }
LAB_0030f8cf:
        bVar6 = (long)uVar17 < 1;
        uVar17 = uVar17 - 1;
        if (bVar6) {
          sprflipvert = false;
          return;
        }
        goto LAB_0030f760;
      }
    }
  }
  return;
LAB_0030faea:
  pFVar14 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[lVar15];
  if (pFVar14->model != rover->model) {
    uVar1 = pFVar14->flags;
    if ((((~uVar1 & 5) == 0) &&
        (psVar4 = (pFVar14->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
       ((psVar5 = (pFVar14->bottom).plane, (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0 &&
        (psVar5->D * psVar5->negiC < sclipTop)))) {
      if (sclipBottom < psVar4->D * psVar4->negiC) {
        if (((uVar1 & 2) == (uVar18 & 2)) &&
           (((uVar1 & 2) != 0 || ((pFVar14->alpha != 0xff && (rover->alpha != 0xff))))))
        goto LAB_0030fcc2;
        if ((uVar18 & uVar1 & 0x10) != 0) {
          pFVar9 = (FTexture *)0xffffffffffffffff;
          goto LAB_0030fd1c;
        }
      }
      goto LAB_0030fcca;
    }
    lVar15 = lVar15 + 1;
    if ((int)uVar12 == lVar15) goto LAB_0030fcca;
    goto LAB_0030faea;
  }
LAB_0030fcc2:
  if (uVar12 != (uint)lVar15) {
    rw_pic = (FTexture *)0x0;
    sprflipvert = false;
    return;
  }
LAB_0030fcca:
  rw_pic = (FTexture *)0x0;
  local_48 = &rover->flags;
  lVar15 = 0x30;
  lVar13 = 0x10;
  ppsVar10 = &curline;
  if (((*local_48 >> 0x11 & 1) == 0) && (lVar15 = 0x90, (*local_48 >> 0x12 & 1) == 0)) {
    ppsVar10 = (seg_t **)&rover->master;
    lVar15 = 0x60;
    lVar13 = 0x48;
  }
  pFVar9 = FTextureManager::operator()
                     (&TexMan,(FTextureID)
                              *(int *)(*(long *)((long)((line_t *)*ppsVar10)->args + lVar13 + -0x2c)
                                      + lVar15),true);
LAB_0030fd1c:
  pFVar14 = (F3DFloor *)0x0;
LAB_0030fd25:
  rw_pic = pFVar9;
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      uVar12 = (backsector->e->XFloor).lightlist.Count;
      do {
        uVar12 = uVar12 - 1;
        if ((int)uVar12 < 0) goto LAB_0030fe68;
        uVar17 = (ulong)(uVar12 & 0x7fffffff);
        plVar16 = (backsector->e->XFloor).lightlist.Array;
      } while (plVar16[uVar17].plane.D * plVar16[uVar17].plane.negiC < sclipTop);
    }
    else {
      uVar12 = (frontsector->e->XFloor).lightlist.Count;
      do {
        uVar12 = uVar12 - 1;
        if ((int)uVar12 < 0) goto LAB_0030fe68;
        uVar17 = (ulong)(uVar12 & 0x7fffffff);
        plVar16 = (frontsector->e->XFloor).lightlist.Array;
      } while (plVar16[uVar17].plane.D * plVar16[uVar17].plane.negiC < sclipTop);
    }
    basecolormap = plVar16[uVar17].extra_colormap;
    iVar8 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar16[uVar17].p_lightlevel,
                       plVar16[uVar17].lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar8 + r_actualextralight) * -0x4000 + 0x3d0000;
  }
LAB_0030fe68:
  if (rw_pic == (FTexture *)0xffffffffffffffff) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if (pFVar14 != (F3DFloor *)0x0) {
    rover = pFVar14;
  }
LAB_003100a0:
  R_RenderFakeWall(ds,x1,x2,rover);
  return;
}

Assistant:

void R_RenderFakeWallRange (drawseg_t *ds, int x1, int x2)
{
	FTexture *const DONT_DRAW = ((FTexture*)(intptr_t)-1);
	int i,j;
	F3DFloor *rover, *fover = NULL;
	int passed, last;
	double floorHeight;
	double ceilingHeight;

	sprflipvert = false;
	curline = ds->curline;

	frontsector = curline->frontsector;
	backsector = curline->backsector;

	if (backsector == NULL)
	{
		return;
	}
	if ((ds->bFakeBoundary & 3) == 2)
	{
		sector_t *sec = backsector;
		backsector = frontsector;
		frontsector = sec;
	}

	floorHeight = backsector->CenterFloor();
	ceilingHeight = backsector->CenterCeiling();

	// maybe fix clipheights
	if (!(fake3D & FAKE3D_CLIPBOTTOM)) sclipBottom = floorHeight;
	if (!(fake3D & FAKE3D_CLIPTOP))    sclipTop = ceilingHeight;

	// maybe not visible
	if (sclipBottom >= frontsector->CenterCeiling()) return;
	if (sclipTop <= frontsector->CenterFloor()) return;

	if (fake3D & FAKE3D_DOWN2UP)
	{ // bottom to viewz
		last = 0;
		for (i = backsector->e->XFloor.ffloors.Size() - 1; i >= 0; i--) 
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) || rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->top.plane->Zat0() <= sclipBottom ||
				rover->bottom.plane->Zat0() >= ceilingHeight ||
				rover->top.plane->Zat0() <= floorHeight)
			{
				if (!i)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}

			rw_pic = NULL;
			if (rover->bottom.plane->Zat0() >= sclipTop || passed) 
			{
				if (last)
				{
					break;
				}
				// maybe wall from inside rendering?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || j == -1)
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{	// don't ever draw (but treat as something has been found)
					rw_pic = DONT_DRAW;
				}
				else if(fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			} 
			else if (frontsector->e->XFloor.ffloors.Size()) 
			{
				// maybe not visible?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model) // never
					{
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(fover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && j != -1)
				{
					fover = NULL;
					last = 1;
					continue; // not visible
				}
			}
			if (!rw_pic) 
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}
			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else rw_pic = NULL;
			break;
		}
	}
	else
	{ // top to viewz
		for (i = 0; i < (int)backsector->e->XFloor.ffloors.Size(); i++)
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) ||
				rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->bottom.plane->Zat0() >= sclipTop ||
				rover->top.plane->Zat0() <= floorHeight ||
				rover->bottom.plane->Zat0() >= ceilingHeight)
			{
				if ((unsigned)i == backsector->e->XFloor.ffloors.Size() - 1)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}
			rw_pic = NULL;
			if (rover->top.plane->Zat0() <= sclipBottom || passed)
			{ // maybe wall from inside rendering?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || (unsigned)j == frontsector->e->XFloor.ffloors.Size())
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{
					rw_pic = DONT_DRAW;	// don't ever draw (but treat as something has been found)
				}
				else if (fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			else if (frontsector->e->XFloor.ffloors.Size())
			{ // maybe not visible?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, its bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(rover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && (unsigned)j != frontsector->e->XFloor.ffloors.Size())
				{ // not visible
					break;
				}
			}
			if (rw_pic == NULL)
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if(sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}

			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else
			{
				rw_pic = NULL;
			}
			break;
		}
	}
	return;
}